

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void palette_rebuild(Terminal *term)

{
  bool bVar1;
  rgb *prVar2;
  uint uVar3;
  uint local_24;
  undefined2 local_1f;
  uint8_t local_1d;
  uint j;
  _Bool found;
  rgb new_value;
  uint i;
  uint max_changed;
  uint min_changed;
  Terminal *term_local;
  
  if ((term->win_palette_pending & 1U) == 0) {
    i = 0x106;
    _found = 0;
  }
  else {
    i = term->win_palette_pending_min;
    _found = term->win_palette_pending_limit - 1;
  }
  j = 0;
  do {
    if (0x105 < j) {
      if (i <= _found) {
        term->win_palette_pending = true;
        term->win_palette_pending_min = i;
        term->win_palette_pending_limit = _found + 1;
        term_invalidate(term);
      }
      return;
    }
    bVar1 = false;
    local_24 = 3;
    do {
      uVar3 = local_24 - 1;
      if (local_24 == 0) goto LAB_0011961d;
      local_24 = uVar3;
    } while ((term->subpalettes[uVar3].present[j] & 1U) == 0);
    prVar2 = term->subpalettes[uVar3].values + j;
    local_1f._0_1_ = prVar2->r;
    local_1f._1_1_ = prVar2->g;
    local_1d = prVar2->b;
    bVar1 = true;
LAB_0011961d:
    if (!bVar1) {
      __assert_fail("found",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x736,"void palette_rebuild(Terminal *)");
    }
    if ((((uint8_t)local_1f != term->palette[j].r) || (local_1f._1_1_ != term->palette[j].g)) ||
       (local_1d != term->palette[j].b)) {
      prVar2 = term->palette + j;
      prVar2->r = (uint8_t)local_1f;
      prVar2->g = local_1f._1_1_;
      prVar2->b = local_1d;
      if (j < i) {
        i = j;
      }
      if (_found < j) {
        _found = j;
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

static void palette_rebuild(Terminal *term)
{
    unsigned min_changed = OSC4_NCOLOURS, max_changed = 0;

    if (term->win_palette_pending) {
        /* Possibly extend existing range. */
        min_changed = term->win_palette_pending_min;
        max_changed = term->win_palette_pending_limit - 1;
    } else {
        /* Start with empty range. */
        min_changed = OSC4_NCOLOURS;
        max_changed = 0;
    }

    for (unsigned i = 0; i < OSC4_NCOLOURS; i++) {
        rgb new_value;
        bool found = false;

        for (unsigned j = lenof(term->subpalettes); j-- > 0 ;) {
            if (term->subpalettes[j].present[i]) {
                new_value = term->subpalettes[j].values[i];
                found = true;
                break;
            }
        }

        assert(found);    /* we expect SUBPAL_CONF to always be set */

        if (new_value.r != term->palette[i].r ||
            new_value.g != term->palette[i].g ||
            new_value.b != term->palette[i].b) {
            term->palette[i] = new_value;
            if (min_changed > i)
                min_changed = i;
            if (max_changed < i)
                max_changed = i;
        }
    }

    if (min_changed <= max_changed) {
        /*
         * At least one colour changed (or we had an update scheduled
         * already). Schedule a redraw event to pass the result back
         * to the TermWin. This also requires invalidating the rest
         * of the window, because usually all the text will need
         * redrawing in the new colours.
         * (If there was an update pending and this palette rebuild
         * didn't actually change anything, we'll harmlessly reinforce
         * the existing update request.)
         */
        term->win_palette_pending = true;
        term->win_palette_pending_min = min_changed;
        term->win_palette_pending_limit = max_changed + 1;
        term_invalidate(term);
    }
}